

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.hpp
# Opt level: O2

void __thiscall
yactfr::internal::TsdlParser::_validateFlIntTypeMapping<yactfr::FixedLengthUnsignedIntegerType>
          (TsdlParser *this,Size len,TextLocation *loc,string *name,MappingRangeSet *ranges)

{
  string msg;
  char *pcVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  undefined8 in_stack_fffffffffffffe30;
  TextLocation in_stack_fffffffffffffe38;
  ostringstream ss;
  
  p_Var2 = (ranges->_ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(ranges->_ranges)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((len < 0x40) && ((_Base_ptr)~(-1L << ((byte)len & 0x3f)) < p_Var2[1]._M_parent)) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"In mapping `");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3,"` of enumeration type: at least one value of the range [");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,"] doesn\'t fit the range [");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,"] (with a length of ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3," bit");
  pcVar1 = "offset_s";
  if (len == 1) {
    pcVar1 = ".[\\*^$\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar1 + 7);
  std::operator<<(poVar3,").");
  std::__cxx11::stringbuf::str();
  msg.field_2._8_8_ = in_stack_fffffffffffffe30;
  msg._0_24_ = *loc;
  throwTextParseError(msg,in_stack_fffffffffffffe38);
}

Assistant:

void TsdlParser::_validateFlIntTypeMapping(const Size len, const TextLocation& loc,
                                           const std::string& name,
                                           const typename FlIntTypeT::MappingRangeSet& ranges) const
{
    using Value = typename FlIntTypeT::MappingValue;

    for (auto& range : ranges) {
        // validate range storage length
        Value minLower, maxUpper;

        if (std::is_signed<Value>::value) {
            if (len < 63) {
                minLower = -(1LL << (len - 1));
                maxUpper = (1LL << (len - 1)) - 1;
            } else {
                minLower = std::numeric_limits<Value>::min();
                maxUpper = std::numeric_limits<Value>::max();
            }
        } else {
            minLower = std::numeric_limits<Value>::min();

            if (len < 64) {
                maxUpper = (1ULL << len) - 1;
            } else {
                maxUpper = std::numeric_limits<Value>::max();
            }
        }

        if (range.lower() < minLower || range.upper() > maxUpper) {
            std::ostringstream ss;

            ss << "In mapping `" << name << "` of enumeration type: "
                  "at least one value of the range [" << range.lower() <<
                  ", " << range.upper() <<
                  "] doesn't fit the range [" << minLower << ", " << maxUpper << "] "
                  "(with a length of " << len << " bit" << ((len == 1) ? "" : "s") << ").";
            throwTextParseError(ss.str(), loc);
        }
    }
}